

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void ma_device__read_frames_from_client(ma_device *pDevice,ma_uint32 frameCount,void *pFramesOut)

{
  ma_uint32 mVar1;
  ma_uint32 mVar2;
  ma_result mVar3;
  ma_uint64 mVar4;
  ma_uint64 requiredInputFrameCount;
  ma_uint64 framesReadThisIterationOut;
  ma_uint64 framesToReadThisIterationOut;
  ma_uint64 framesReadThisIterationIn;
  ma_uint64 framesToReadThisIterationIn;
  ma_uint64 intermediaryBufferCap;
  ma_uint8 pIntermediaryBuffer [4096];
  void *local_50;
  void *pRunningFramesOut;
  ma_uint64 totalFramesReadIn;
  ma_uint64 totalFramesReadOut;
  ma_result result;
  void *pFramesOut_local;
  ma_uint32 frameCount_local;
  ma_device *pDevice_local;
  
  if (pDevice == (ma_device *)0x0) {
    __assert_fail("pDevice != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x22ee,"void ma_device__read_frames_from_client(ma_device *, ma_uint32, void *)")
    ;
  }
  if (frameCount == 0) {
    __assert_fail("frameCount > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x22ef,"void ma_device__read_frames_from_client(ma_device *, ma_uint32, void *)")
    ;
  }
  if (pFramesOut == (void *)0x0) {
    __assert_fail("pFramesOut != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x22f0,"void ma_device__read_frames_from_client(ma_device *, ma_uint32, void *)")
    ;
  }
  if (((byte)(pDevice->playback).converter.field_0x2768 >> 4 & 1) == 0) {
    totalFramesReadIn = 0;
    local_50 = pFramesOut;
    do {
      if (frameCount <= totalFramesReadIn) {
        return;
      }
      mVar1 = (pDevice->playback).channels;
      mVar2 = ma_get_bytes_per_sample((pDevice->playback).format);
      framesToReadThisIterationIn =
           SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) / ZEXT416(mVar2 * mVar1),0);
      framesReadThisIterationOut = frameCount - totalFramesReadIn;
      framesReadThisIterationIn = framesReadThisIterationOut;
      if (framesToReadThisIterationIn < framesReadThisIterationOut) {
        framesReadThisIterationIn = framesToReadThisIterationIn;
      }
      mVar4 = ma_data_converter_get_required_input_frame_count
                        (&(pDevice->playback).converter,(ulong)frameCount);
      if (mVar4 < framesReadThisIterationIn) {
        framesReadThisIterationIn = mVar4;
      }
      if (framesReadThisIterationIn != 0) {
        ma_device__on_data(pDevice,&intermediaryBufferCap,(void *)0x0,
                           (ma_uint32)framesReadThisIterationIn);
      }
      framesToReadThisIterationOut = framesReadThisIterationIn;
      requiredInputFrameCount = framesReadThisIterationOut;
      mVar3 = ma_data_converter_process_pcm_frames
                        (&(pDevice->playback).converter,&intermediaryBufferCap,
                         &framesToReadThisIterationOut,local_50,&requiredInputFrameCount);
      mVar4 = requiredInputFrameCount;
      if (mVar3 != 0) {
        return;
      }
      totalFramesReadIn = requiredInputFrameCount + totalFramesReadIn;
      mVar1 = (pDevice->playback).internalChannels;
      mVar2 = ma_get_bytes_per_sample((pDevice->playback).internalFormat);
      local_50 = (void *)((long)local_50 + mVar4 * (mVar2 * mVar1));
    } while ((framesToReadThisIterationOut != 0) || (requiredInputFrameCount != 0));
  }
  else {
    ma_device__on_data(pDevice,pFramesOut,(void *)0x0,frameCount);
  }
  return;
}

Assistant:

static void ma_device__read_frames_from_client(ma_device* pDevice, ma_uint32 frameCount, void* pFramesOut)
{
    MA_ASSERT(pDevice != NULL);
    MA_ASSERT(frameCount > 0);
    MA_ASSERT(pFramesOut != NULL);

    if (pDevice->playback.converter.isPassthrough) {
        ma_device__on_data(pDevice, pFramesOut, NULL, frameCount);
    } else {
        ma_result result;
        ma_uint64 totalFramesReadOut;
        ma_uint64 totalFramesReadIn;
        void* pRunningFramesOut;

        totalFramesReadOut = 0;
        totalFramesReadIn  = 0;
        pRunningFramesOut  = pFramesOut;

        while (totalFramesReadOut < frameCount) {
            ma_uint8 pIntermediaryBuffer[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];  /* In client format. */
            ma_uint64 intermediaryBufferCap = sizeof(pIntermediaryBuffer) / ma_get_bytes_per_frame(pDevice->playback.format, pDevice->playback.channels);
            ma_uint64 framesToReadThisIterationIn;
            ma_uint64 framesReadThisIterationIn;
            ma_uint64 framesToReadThisIterationOut;
            ma_uint64 framesReadThisIterationOut;
            ma_uint64 requiredInputFrameCount;

            framesToReadThisIterationOut = (frameCount - totalFramesReadOut);
            framesToReadThisIterationIn = framesToReadThisIterationOut;
            if (framesToReadThisIterationIn > intermediaryBufferCap) {
                framesToReadThisIterationIn = intermediaryBufferCap;
            }

            requiredInputFrameCount = ma_data_converter_get_required_input_frame_count(&pDevice->playback.converter, frameCount);
            if (framesToReadThisIterationIn > requiredInputFrameCount) {
                framesToReadThisIterationIn = requiredInputFrameCount;
            }

            if (framesToReadThisIterationIn > 0) {
                ma_device__on_data(pDevice, pIntermediaryBuffer, NULL, (ma_uint32)framesToReadThisIterationIn);
                totalFramesReadIn += framesToReadThisIterationIn;
            }

            /*
            At this point we have our decoded data in input format and now we need to convert to output format. Note that even if we didn't read any
            input frames, we still want to try processing frames because there may some output frames generated from cached input data.
            */
            framesReadThisIterationIn  = framesToReadThisIterationIn;
            framesReadThisIterationOut = framesToReadThisIterationOut;
            result = ma_data_converter_process_pcm_frames(&pDevice->playback.converter, pIntermediaryBuffer, &framesReadThisIterationIn, pRunningFramesOut, &framesReadThisIterationOut);
            if (result != MA_SUCCESS) {
                break;
            }

            totalFramesReadOut += framesReadThisIterationOut;
            pRunningFramesOut   = ma_offset_ptr(pRunningFramesOut, framesReadThisIterationOut * ma_get_bytes_per_frame(pDevice->playback.internalFormat, pDevice->playback.internalChannels));

            if (framesReadThisIterationIn == 0 && framesReadThisIterationOut == 0) {
                break;  /* We're done. */
            }
        }
    }
}